

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::
Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
::Action(Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
         *this,ActionInterface<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
               *impl)

{
  __shared_ptr<testing::ActionInterface<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>(std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&,int,unsigned_int)>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>(std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&,int,unsigned_int)>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::ActionInterface<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>(std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&,int,unsigned_int)>,void>
            (local_20,impl);
  std::
  function<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>(std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&,int,unsigned_int)>
  ::
  function<testing::Action<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>(std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&,int,unsigned_int)>::ActionAdapter,void>
            ((function<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>(std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&,int,unsigned_int)>
              *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}